

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcpaddress.cpp
# Opt level: O3

RTPAddress * __thiscall
jrtplib::RTPTCPAddress::CreateCopy(RTPTCPAddress *this,RTPMemoryManager *mgr)

{
  undefined4 uVar1;
  int iVar2;
  undefined4 extraout_var;
  RTPAddress *pRVar3;
  
  if (mgr == (RTPMemoryManager *)0x0) {
    pRVar3 = (RTPAddress *)operator_new(0x10);
  }
  else {
    iVar2 = (*mgr->_vptr_RTPMemoryManager[2])(mgr,0x10,0x17);
    pRVar3 = (RTPAddress *)CONCAT44(extraout_var,iVar2);
  }
  uVar1 = *(undefined4 *)&(this->super_RTPAddress).field_0xc;
  pRVar3->addresstype = TCPAddress;
  pRVar3->_vptr_RTPAddress = (_func_int **)&PTR_CreateCopy_0013cce8;
  *(undefined4 *)&pRVar3->field_0xc = uVar1;
  return pRVar3;
}

Assistant:

RTPAddress *RTPTCPAddress::CreateCopy(RTPMemoryManager *mgr) const
{
	JRTPLIB_UNUSED(mgr); // possibly unused
	RTPTCPAddress *a = RTPNew(mgr,RTPMEM_TYPE_CLASS_RTPADDRESS) RTPTCPAddress(m_socket);
	return a;
}